

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::swap
          (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this,
          Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *other)

{
  long *in_RSI;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *in_RDI;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *in_stack_00000018;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> copy;
  
  if (in_RDI->arena_ == (Arena *)*in_RSI) {
    std::swap<int>(&in_RDI->default_enum_value_,(int *)(in_RSI + 1));
    std::
    swap<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap*>
              (&in_RDI->elements_,(InnerMap **)(in_RSI + 2));
  }
  else {
    Map((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)copy.arena_,
        in_stack_00000018);
    operator=((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)copy.arena_,
              in_stack_00000018);
    operator=((Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)copy.arena_,
              in_stack_00000018);
    ~Map(in_RDI);
  }
  return;
}

Assistant:

void swap(Map& other) {
    if (arena_ == other.arena_) {
      std::swap(default_enum_value_, other.default_enum_value_);
      std::swap(elements_, other.elements_);
    } else {
      // TODO(zuguang): optimize this. The temporary copy can be allocated
      // in the same arena as the other message, and the "other = copy" can
      // be replaced with the fast-path swap above.
      Map copy = *this;
      *this = other;
      other = copy;
    }
  }